

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void removeFile(string *path)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  char *__s2;
  inode *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ostream *poVar9;
  undefined1 *puVar10;
  ulong uVar11;
  string names [100];
  char *local_d38;
  long local_d30;
  char local_d28 [16];
  char *local_d18;
  long local_d10;
  char local_d08 [16];
  char *local_cf8;
  long local_cf0;
  char local_ce8 [16];
  string local_cd8;
  string local_cb8 [99];
  undefined8 auStack_58 [2];
  char local_48 [24];
  
  lVar8 = 0x10;
  do {
    puVar10 = (undefined1 *)((long)&local_cb8[0]._M_dataplus._M_p + lVar8);
    *(undefined1 **)((long)local_cb8 + lVar8 + -0x10) = puVar10;
    *(undefined8 *)((long)local_cb8 + lVar8 + -8) = 0;
    *puVar10 = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0xc90);
  pcVar3 = (path->_M_dataplus)._M_p;
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cd8,pcVar3,pcVar3 + path->_M_string_length);
  iVar5 = parsePath(&local_cd8,local_cb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  pcVar3 = (path->_M_dataplus)._M_p;
  local_cf8 = local_ce8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cf8,pcVar3,pcVar3 + path->_M_string_length);
  iVar6 = doesExist(local_cb8,iVar5,local_cf0 == 0 || *local_cf8 != '/');
  if (local_cf8 != local_ce8) {
    operator_delete(local_cf8);
  }
  if (iVar6 == iVar5) {
    pcVar3 = (path->_M_dataplus)._M_p;
    local_d18 = local_d08;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d18,pcVar3,pcVar3 + path->_M_string_length);
    iVar6 = getId(local_cb8,iVar5,local_d10 == 0 || *local_d18 != '/');
    if (local_d18 != local_d08) {
      operator_delete(local_d18);
    }
    super_block.inode_bitmap[iVar6] = false;
    iVar1 = inodes[iVar6].i_file_size;
    iVar2 = inodes[iVar6].i_blocks[0];
    super_block.block_bitmap[iVar2] = false;
    memset(emptyspaces + (long)iVar2 * 0x1000,0,0x1000);
    inodes[iVar6].i_id = 0;
    inodes[iVar6].i_mode = 0;
    inodes[iVar6].i_file_size = 0;
    inodes[iVar6].i_blocks[0] = 0;
    piVar4 = inodes + iVar6;
    piVar4->i_place_holder[0] = '\0';
    piVar4->i_place_holder[1] = '\0';
    piVar4->i_place_holder[2] = '\0';
    piVar4->i_place_holder[3] = '\0';
    piVar4->i_place_holder[4] = '\0';
    piVar4->i_place_holder[5] = '\0';
    piVar4->i_place_holder[6] = '\0';
    piVar4->i_place_holder[7] = '\0';
    piVar4 = inodes + iVar6;
    piVar4->i_place_holder[8] = '\0';
    piVar4->i_place_holder[9] = '\0';
    piVar4->i_place_holder[10] = '\0';
    piVar4->i_place_holder[0xb] = '\0';
    piVar4->i_place_holder[0xc] = '\0';
    piVar4->i_place_holder[0xd] = '\0';
    piVar4->i_place_holder[0xe] = '\0';
    piVar4->i_place_holder[0xf] = '\0';
    pcVar3 = (path->_M_dataplus)._M_p;
    local_d38 = local_d28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d38,pcVar3,pcVar3 + path->_M_string_length);
    uVar7 = getId(local_cb8,iVar5 + -1,local_d30 == 0 || *local_d38 != '/');
    uVar11 = (ulong)uVar7;
    if (local_d38 != local_d28) {
      operator_delete(local_d38);
    }
    iVar6 = inodes[(int)uVar7].i_blocks[0];
    __s2 = local_cb8[iVar5 + -1]._M_dataplus._M_p;
    lVar8 = 0;
    do {
      iVar5 = strcmp(emptyspaces + lVar8 + (long)iVar6 * 0x1000,__s2);
      if (iVar5 == 0) {
        memset(emptyspaces + lVar8 + (long)iVar6 * 0x1000,0,0x100);
        break;
      }
      lVar8 = lVar8 + 0x100;
    } while (lVar8 != 0x1000);
    inodes[(int)uVar7].i_file_size = inodes[(int)uVar7].i_file_size - iVar1;
    if (uVar7 != 0) {
      do {
        uVar11 = (ulong)*(int *)(emptyspaces +
                                (long)inodes[(int)uVar11].i_blocks[0] * 0x1000 + 0x1fc);
        inodes[uVar11].i_file_size = inodes[uVar11].i_file_size - iVar1;
      } while (uVar11 != 0);
    }
  }
  else {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": No such file or directory.\n",0x1d)
    ;
  }
  lVar8 = 0;
  do {
    if (local_48 + lVar8 != *(char **)((long)auStack_58 + lVar8)) {
      operator_delete(*(char **)((long)auStack_58 + lVar8));
    }
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0xc80);
  return;
}

Assistant:

void removeFile(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        int size = inodes[id].i_file_size;
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(File_Block));
        memset(q, '\0', sizeof(inode));
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到母文件夹
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
        inodes[parentid].i_file_size -= size;
        while(parentid != 0){
            parentid = getParentById(parentid);
            inodes[parentid].i_file_size -= size;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << path << ": No such file or directory.\n";
        setColor(COLOR_ORIGIN);
    }
}